

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalOperator::Deserialize(LogicalOperator *this,Deserializer *deserializer)

{
  _Elt_pointer puVar1;
  _func_int **pp_Var2;
  undefined1 auVar3 [8];
  LogicalOperatorType LVar4;
  int iVar5;
  pointer pLVar6;
  SerializationException *this_00;
  pointer *__ptr;
  undefined1 auVar7 [8];
  uint uVar8;
  string str;
  type ret;
  undefined1 local_68 [8];
  pointer puStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  local_48;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    LVar4 = EnumUtil::FromString<duckdb::LogicalOperatorType>((char *)local_68);
    uVar8 = (uint)LVar4;
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68);
    }
  }
  else {
    uVar8 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"children");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_allocated_capacity = 0;
    local_68 = (undefined1  [8])0x0;
    puStack_60 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               *)local_68);
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,true>>
              ((type *)&local_48,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar8 = uVar8 & 0xff;
  local_68 = (undefined1  [8])(ulong)uVar8;
  puVar1 = (deserializer->data).enums.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (deserializer->data).enums.c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(deserializer->data).enums.c,(unsigned_long *)local_68);
  }
  else {
    *puVar1 = (unsigned_long)local_68;
    (deserializer->data).enums.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar1 + 1;
  }
  this->_vptr_LogicalOperator = (_func_int **)0x0;
  if (100 < uVar8) {
    if (uVar8 < 0xb1) {
      switch(uVar8) {
      case 0x7d:
        LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
        break;
      case 0x7e:
        LogicalCreateTable::Deserialize((LogicalCreateTable *)local_68,deserializer);
        break;
      case 0x7f:
        LogicalCreateIndex::Deserialize((LogicalCreateIndex *)local_68,deserializer);
        break;
      case 0x80:
        LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
        break;
      case 0x81:
        LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
        break;
      case 0x82:
        LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
        break;
      case 0x83:
        LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
        break;
      case 0x84:
        LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
        break;
      case 0x85:
      case 0x8a:
      case 0x8b:
      case 0x8c:
      case 0x8d:
      case 0x8e:
      case 0x8f:
      case 0x90:
      case 0x91:
      case 0x92:
      case 0x93:
      case 0x94:
      case 0x95:
        goto switchD_010ad6e2_caseD_85;
      case 0x86:
        LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
        break;
      case 0x87:
        LogicalCreate::Deserialize((LogicalCreate *)local_68,deserializer);
        break;
      case 0x88:
        LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
        break;
      case 0x89:
        LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
        break;
      case 0x96:
        LogicalExplain::Deserialize((LogicalExplain *)local_68,deserializer);
        break;
      default:
        if (uVar8 == 0x65) {
          LogicalDelete::Deserialize((LogicalDelete *)local_68,deserializer);
        }
        else {
          if (uVar8 != 0x66) goto switchD_010ad6e2_caseD_85;
          LogicalUpdate::Deserialize((LogicalUpdate *)local_68,deserializer);
        }
      }
      goto LAB_010adaa9;
    }
    switch(uVar8) {
    case 0xb1:
      LogicalExport::Deserialize((LogicalExport *)local_68,deserializer);
      break;
    case 0xb2:
      LogicalVacuum::Deserialize((LogicalVacuum *)local_68,deserializer);
      goto LAB_010ada03;
    case 0xb3:
      LogicalSet::Deserialize((LogicalSet *)local_68,deserializer);
      break;
    case 0xb4:
      LogicalSimple::Deserialize((LogicalSimple *)local_68,deserializer);
      break;
    case 0xb5:
      LogicalReset::Deserialize((LogicalReset *)local_68,deserializer);
      break;
    default:
      if (uVar8 != 0xff) goto switchD_010ad6e2_caseD_85;
      LogicalExtensionOperator::Deserialize((LogicalExtensionOperator *)local_68,deserializer);
      goto LAB_010ada03;
    }
    goto LAB_010adaa9;
  }
  switch(uVar8) {
  case 1:
    LogicalProjection::Deserialize((LogicalProjection *)local_68,deserializer);
    break;
  case 2:
    LogicalFilter::Deserialize((LogicalFilter *)local_68,deserializer);
    break;
  case 3:
    LogicalAggregate::Deserialize((LogicalAggregate *)local_68,deserializer);
    break;
  case 4:
    LogicalWindow::Deserialize((LogicalWindow *)local_68,deserializer);
    break;
  case 5:
    LogicalUnnest::Deserialize((LogicalUnnest *)local_68,deserializer);
    break;
  case 6:
    LogicalLimit::Deserialize((LogicalLimit *)local_68,deserializer);
    break;
  case 7:
    LogicalOrder::Deserialize((LogicalOrder *)local_68,deserializer);
    break;
  case 8:
    LogicalTopN::Deserialize((LogicalTopN *)local_68,deserializer);
    break;
  case 9:
  case 0xd:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
switchD_010ad6e2_caseD_85:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_68 = (undefined1  [8])&local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unsupported type for deserialization of LogicalOperator!","");
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    LogicalCopyToFile::Deserialize((LogicalCopyToFile *)local_68,deserializer);
    goto LAB_010ada03;
  case 0xb:
    LogicalDistinct::Deserialize((LogicalDistinct *)local_68,deserializer);
    break;
  case 0xc:
    LogicalSample::Deserialize((LogicalSample *)local_68,deserializer);
    break;
  case 0xe:
    LogicalPivot::Deserialize((LogicalPivot *)local_68,deserializer);
    break;
  case 0xf:
    LogicalCopyDatabase::Deserialize((LogicalCopyDatabase *)local_68,deserializer);
    break;
  case 0x19:
    LogicalGet::Deserialize((LogicalGet *)local_68,deserializer);
LAB_010ada03:
    auVar7 = local_68;
    local_68 = (undefined1  [8])0x0;
    pp_Var2 = this->_vptr_LogicalOperator;
    this->_vptr_LogicalOperator = (_func_int **)auVar7;
    auVar7 = local_68;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))();
      auVar7 = local_68;
    }
    goto LAB_010adabb;
  case 0x1a:
    LogicalColumnDataGet::Deserialize((LogicalColumnDataGet *)local_68,deserializer);
    break;
  case 0x1b:
    LogicalDelimGet::Deserialize((LogicalDelimGet *)local_68,deserializer);
    break;
  case 0x1c:
    LogicalExpressionGet::Deserialize((LogicalExpressionGet *)local_68,deserializer);
    break;
  case 0x1d:
    LogicalDummyScan::Deserialize((LogicalDummyScan *)local_68,deserializer);
    break;
  case 0x1e:
    LogicalEmptyResult::Deserialize((LogicalEmptyResult *)local_68,deserializer);
    break;
  case 0x1f:
    LogicalCTERef::Deserialize((LogicalCTERef *)local_68,deserializer);
    break;
  case 0x33:
    LogicalComparisonJoin::Deserialize((LogicalComparisonJoin *)local_68,deserializer);
    break;
  case 0x34:
    LogicalComparisonJoin::Deserialize((LogicalComparisonJoin *)local_68,deserializer);
    break;
  case 0x35:
    LogicalAnyJoin::Deserialize((LogicalAnyJoin *)local_68,deserializer);
    break;
  case 0x36:
    LogicalCrossProduct::Deserialize((Deserializer *)local_68);
    break;
  case 0x37:
    LogicalPositionalJoin::Deserialize((Deserializer *)local_68);
    break;
  case 0x38:
    LogicalComparisonJoin::Deserialize((LogicalComparisonJoin *)local_68,deserializer);
    break;
  default:
    switch(uVar8) {
    case 0x4b:
      LogicalSetOperation::Deserialize((LogicalSetOperation *)local_68,deserializer);
      break;
    case 0x4c:
      LogicalSetOperation::Deserialize((LogicalSetOperation *)local_68,deserializer);
      break;
    case 0x4d:
      LogicalSetOperation::Deserialize((LogicalSetOperation *)local_68,deserializer);
      break;
    case 0x4e:
      LogicalRecursiveCTE::Deserialize((LogicalRecursiveCTE *)local_68,deserializer);
      break;
    case 0x4f:
      LogicalMaterializedCTE::Deserialize((LogicalMaterializedCTE *)local_68,deserializer);
      break;
    default:
      if (uVar8 != 100) goto switchD_010ad6e2_caseD_85;
      LogicalInsert::Deserialize((LogicalInsert *)local_68,deserializer);
    }
  }
LAB_010adaa9:
  auVar3 = local_68;
  local_68 = (undefined1  [8])0x0;
  auVar7 = (undefined1  [8])this->_vptr_LogicalOperator;
  this->_vptr_LogicalOperator = (_func_int **)auVar3;
LAB_010adabb:
  if (auVar7 != (undefined1  [8])0x0) {
    (**(code **)&((((pointer)auVar7)->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->type)();
  }
  Deserializer::Unset<duckdb::LogicalOperatorType>(deserializer);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)this);
  local_68 = (undefined1  [8])
             (pLVar6->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  puStack_60 = (pLVar6->children).
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_allocated_capacity =
       (size_type)
       (pLVar6->children).
       super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pLVar6->children).
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pLVar6->children).
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pLVar6->children).
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             *)local_68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector(&local_48);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalOperator::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<LogicalOperatorType>(100, "type");
	auto children = deserializer.ReadPropertyWithDefault<vector<unique_ptr<LogicalOperator>>>(101, "children");
	deserializer.Set<LogicalOperatorType>(type);
	unique_ptr<LogicalOperator> result;
	switch (type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		result = LogicalAggregate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ALTER:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
		result = LogicalAnyJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		result = LogicalComparisonJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ATTACH:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CHUNK_GET:
		result = LogicalColumnDataGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		result = LogicalComparisonJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_COPY_DATABASE:
		result = LogicalCopyDatabase::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_COPY_TO_FILE:
		result = LogicalCopyToFile::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_INDEX:
		result = LogicalCreateIndex::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_MACRO:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_SCHEMA:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_SEQUENCE:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_TABLE:
		result = LogicalCreateTable::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_TYPE:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CREATE_VIEW:
		result = LogicalCreate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		result = LogicalCrossProduct::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_CTE_REF:
		result = LogicalCTERef::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DELETE:
		result = LogicalDelete::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DELIM_GET:
		result = LogicalDelimGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		result = LogicalComparisonJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DETACH:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DISTINCT:
		result = LogicalDistinct::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DROP:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_DUMMY_SCAN:
		result = LogicalDummyScan::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EMPTY_RESULT:
		result = LogicalEmptyResult::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXCEPT:
		result = LogicalSetOperation::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXPLAIN:
		result = LogicalExplain::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXPORT:
		result = LogicalExport::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXPRESSION_GET:
		result = LogicalExpressionGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR:
		result = LogicalExtensionOperator::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_FILTER:
		result = LogicalFilter::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_GET:
		result = LogicalGet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_INSERT:
		result = LogicalInsert::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_INTERSECT:
		result = LogicalSetOperation::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_LIMIT:
		result = LogicalLimit::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_LOAD:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
		result = LogicalMaterializedCTE::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		result = LogicalOrder::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_PIVOT:
		result = LogicalPivot::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		result = LogicalPositionalJoin::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_PROJECTION:
		result = LogicalProjection::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
		result = LogicalRecursiveCTE::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_RESET:
		result = LogicalReset::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_SAMPLE:
		result = LogicalSample::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_SET:
		result = LogicalSet::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_TOP_N:
		result = LogicalTopN::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_TRANSACTION:
		result = LogicalSimple::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_UNION:
		result = LogicalSetOperation::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_UNNEST:
		result = LogicalUnnest::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_UPDATE:
		result = LogicalUpdate::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_VACUUM:
		result = LogicalVacuum::Deserialize(deserializer);
		break;
	case LogicalOperatorType::LOGICAL_WINDOW:
		result = LogicalWindow::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of LogicalOperator!");
	}
	deserializer.Unset<LogicalOperatorType>();
	result->children = std::move(children);
	return result;
}